

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool httplib::detail::redirect<httplib::SSLClient>
               (SSLClient *cli,Request *req,Response *res,string *path,string *location,Error *error
               )

{
  int iVar1;
  ssize_t sVar2;
  int __flags;
  undefined1 local_378 [8];
  Request new_req;
  Response new_res;
  
  new_res._256_8_ = location;
  Request::Request((Request *)local_378,req);
  __flags = (int)location;
  std::__cxx11::string::_M_assign((string *)(new_req.method.field_2._M_local_buf + 8));
  new_req.ssl = new_req.ssl + -1;
  if (res->status == 0x12f) {
    iVar1 = std::__cxx11::string::compare((char *)req);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)req);
      if (iVar1 != 0) {
        __flags = 3;
        std::__cxx11::string::_M_replace
                  ((ulong)local_378,0,new_req.method._M_dataplus._M_p,0x1f6cea);
        new_req.body._M_dataplus._M_p = (pointer)0x0;
        *(undefined1 *)new_req.headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)((long)&new_req.path.field_2 + 8));
      }
    }
  }
  new_req.authorization_count_ = (size_t)&new_res.version._M_string_length;
  new_res.version._M_dataplus._M_p = (pointer)0x0;
  new_res.version._M_string_length._0_1_ = 0;
  new_res.version.field_2._8_4_ = 0xffffffff;
  new_res._32_8_ = &new_res.reason._M_string_length;
  new_res.reason._M_dataplus._M_p = (pointer)0x0;
  new_res.reason._M_string_length._0_1_ = 0;
  new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&new_res.headers;
  new_res.headers._M_t._M_impl._0_4_ = 0;
  new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  new_res.headers._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)&new_res.body._M_string_length;
  new_res.body._M_dataplus._M_p = (pointer)0x0;
  new_res.body._M_string_length._0_1_ = 0;
  new_res.body.field_2._8_8_ = &new_res.location._M_string_length;
  new_res.location._M_dataplus._M_p = (pointer)0x0;
  new_res.location._M_string_length._0_1_ = 0;
  new_res.location.field_2._8_8_ = 0;
  new_res.content_length_ = 0;
  new_res.content_provider_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  new_res.content_provider_.super__Function_base._M_functor._8_8_ = 0;
  new_res.content_provider_.super__Function_base._M_manager = (_Manager_type)0x0;
  new_res.content_provider_._M_invoker = (_Invoker_type)0x0;
  new_res.content_provider_resource_releaser_.super__Function_base._M_functor._M_unused._M_object =
       (void *)0x0;
  new_res.content_provider_resource_releaser_.super__Function_base._M_functor._8_2_ = 0;
  new_res.content_provider_resource_releaser_.super__Function_base._M_functor._10_6_ = 0;
  new_res.content_provider_resource_releaser_.super__Function_base._M_manager._0_2_ = 0;
  new_res.content_provider_resource_releaser_._18_8_ = 0;
  new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       new_res.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  sVar2 = ClientImpl::send(&cli->super_ClientImpl,(int)local_378,&new_req.authorization_count_,
                           (size_t)error,__flags);
  if ((char)sVar2 != '\0') {
    Request::operator=(req,(Request *)local_378);
    Response::operator=(res,(Response *)&new_req.authorization_count_);
    std::__cxx11::string::_M_assign((string *)&res->location);
  }
  Response::~Response((Response *)&new_req.authorization_count_);
  Request::~Request((Request *)local_378);
  return (bool)(char)sVar2;
}

Assistant:

inline bool redirect(T& cli, Request& req, Response& res,
            const std::string& path, const std::string& location,
            Error& error) {
            Request new_req = req;
            new_req.path = path;
            new_req.redirect_count_ -= 1;

            if (res.status == 303 && (req.method != "GET" && req.method != "HEAD")) {
                new_req.method = "GET";
                new_req.body.clear();
                new_req.headers.clear();
            }

            Response new_res;

            auto ret = cli.send(new_req, new_res, error);
            if (ret) {
                req = new_req;
                res = new_res;
                res.location = location;
            }
            return ret;
        }